

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O2

Vec3f __thiscall embree::getVec3f(embree *this,char **token)

{
  char *__s;
  size_t sVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 extraout_XMM0_Db;
  Vec3f VVar6;
  ulong uVar5;
  
  fVar2 = getFloat(token);
  __s = *token;
  sVar1 = strspn(__s," \t");
  *token = __s + sVar1;
  uVar5 = (ulong)(uint)fVar2;
  fVar3 = fVar2;
  if (__s[sVar1] != '\0') {
    fVar3 = getFloat(token);
    fVar4 = getFloat(token);
    uVar5 = CONCAT44(extraout_XMM0_Db,fVar4);
  }
  *(float *)this = fVar2;
  *(float *)(this + 4) = fVar3;
  *(int *)(this + 8) = (int)uVar5;
  VVar6.field_0.field_0.z = fVar2;
  VVar6.field_0._0_8_ = uVar5;
  return (Vec3f)VVar6.field_0;
}

Assistant:

static inline Vec3f getVec3f(const char*& token) {
    float x = getFloat(token);
    token += strspn(token, " \t");
    if (*token == 0) return Vec3f(x);
    float y = getFloat(token);
    float z = getFloat(token);
    return Vec3f(x,y,z);
  }